

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_add_many(void **param_1)

{
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *b;
  iterator __last;
  roaring64_bitmap_t *r_00;
  uint64_t value;
  roaring64_bitmap_t *r_1;
  uint64_t i;
  array<unsigned_long,_1000UL> vals;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_ffffffffffffe078;
  int line;
  roaring64_bitmap_t *r_01;
  size_t in_stack_ffffffffffffe098;
  size_t n_args;
  roaring64_bitmap_t *in_stack_ffffffffffffe0a0;
  ulong local_1f58;
  roaring64_bitmap_t *in_stack_ffffffffffffe100;
  roaring64_bitmap_t *in_stack_ffffffffffffe110;
  
  prVar1 = roaring64_bitmap_create();
  b = (roaring64_bitmap_t *)
      std::array<unsigned_long,_1000UL>::begin((array<unsigned_long,_1000UL> *)0x1031e6);
  __last = std::array<unsigned_long,_1000UL>::end((array<unsigned_long,_1000UL> *)0x1031f5);
  std::iota<unsigned_long*,int>((unsigned_long *)b,__last,0);
  r_01 = prVar1;
  r_00 = (roaring64_bitmap_t *)
         std::array<unsigned_long,_1000UL>::size
                   ((array<unsigned_long,_1000UL> *)&stack0xffffffffffffe0b0);
  std::array<unsigned_long,_1000UL>::data((array<unsigned_long,_1000UL> *)0x10322a);
  roaring64_bitmap_add_many(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,(uint64_t *)r_00);
  assert_r64_valid(b);
  for (local_1f58 = 0; line = (int)((ulong)in_stack_ffffffffffffe078 >> 0x20), local_1f58 < 1000;
      local_1f58 = local_1f58 + 1) {
    in_stack_ffffffffffffe078 = prVar1;
    std::array<unsigned_long,_1000UL>::operator[]
              ((array<unsigned_long,_1000UL> *)b,(size_type)prVar1);
    roaring64_bitmap_contains(r_01,(uint64_t)b);
    _assert_true((unsigned_long)r_00,(char *)r_01,(char *)b,
                 (int)((ulong)in_stack_ffffffffffffe078 >> 0x20));
  }
  roaring64_bitmap_free(in_stack_ffffffffffffe100);
  prVar1 = roaring64_bitmap_create();
  n_args = 0;
  roaring64_bitmap_add(r_00,(uint64_t)r_01);
  roaring64_bitmap_contains(r_01,(uint64_t)b);
  _assert_true((unsigned_long)r_00,(char *)r_01,(char *)b,line);
  roaring64_bitmap_add_many(prVar1,n_args,(uint64_t *)r_00);
  assert_r64_valid(b);
  roaring64_bitmap_contains(r_01,(uint64_t)b);
  _assert_true((unsigned_long)r_00,(char *)r_01,(char *)b,line);
  roaring64_bitmap_get_cardinality(in_stack_ffffffffffffe110);
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)b,line);
  roaring64_bitmap_free(in_stack_ffffffffffffe100);
  return;
}

Assistant:

DEFINE_TEST(test_add_many) {
    {
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        std::array<uint64_t, 1000> vals;
        std::iota(vals.begin(), vals.end(), 0);

        roaring64_bitmap_add_many(r, vals.size(), vals.data());
        assert_r64_valid(r);
        for (uint64_t i = 0; i < 1000; ++i) {
            assert_true(roaring64_bitmap_contains(r, vals[i]));
        }

        roaring64_bitmap_free(r);
    }

    {
        // Add many_where value already exists
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        uint64_t value = 0;
        roaring64_bitmap_add(r, value);
        assert_true(roaring64_bitmap_contains(r, value));
        roaring64_bitmap_add_many(r, 1, &value);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, value));
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 1);
        roaring64_bitmap_free(r);
    }
}